

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O2

ShaderMacroArray Diligent::GetShaderTypeMacros(SHADER_TYPE Type)

{
  undefined1 *puVar1;
  ShaderMacroArray SVar2;
  ulong uStack_30;
  string msg;
  
  uStack_30 = (ulong)Type;
  switch(Type) {
  case SHADER_TYPE_VERTEX:
    puVar1 = (anonymous_namespace)::VSMacros;
    break;
  case SHADER_TYPE_PIXEL:
    puVar1 = (anonymous_namespace)::PSMacros;
    break;
  case SHADER_TYPE_VS_PS:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VERTEX:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_PIXEL:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VS_PS:
switchD_001b5357_caseD_3:
    FormatString<char[23]>(&msg,(char (*) [23])"Unexpected shader type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetShaderTypeMacros",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
               ,0x5c);
LAB_001b5390:
    std::__cxx11::string::~string((string *)&msg);
    uStack_30 = 0;
    puVar1 = (undefined1 *)0x0;
    break;
  case SHADER_TYPE_GEOMETRY:
    puVar1 = (anonymous_namespace)::GSMacros;
    goto LAB_001b5413;
  case SHADER_TYPE_HULL:
    puVar1 = (anonymous_namespace)::HSMacros;
LAB_001b53d2:
    uStack_30 = 2;
    break;
  default:
    if (Type == SHADER_TYPE_DOMAIN) {
      puVar1 = (anonymous_namespace)::DSMacros;
      goto LAB_001b53d2;
    }
    if (Type == SHADER_TYPE_COMPUTE) {
      puVar1 = (anonymous_namespace)::CSMacros;
    }
    else {
      if (Type == SHADER_TYPE_AMPLIFICATION) {
        puVar1 = (anonymous_namespace)::ASMacros;
        goto LAB_001b53d2;
      }
      if (Type == SHADER_TYPE_MESH) {
        puVar1 = (anonymous_namespace)::MSMacros;
      }
      else if (Type == SHADER_TYPE_RAY_GEN) {
        puVar1 = (anonymous_namespace)::RGMacros;
      }
      else if (Type == SHADER_TYPE_RAY_MISS) {
        puVar1 = (anonymous_namespace)::RMMacros;
      }
      else if (Type == SHADER_TYPE_RAY_CLOSEST_HIT) {
        puVar1 = (anonymous_namespace)::RCHMacros;
      }
      else if (Type == SHADER_TYPE_RAY_ANY_HIT) {
        puVar1 = (anonymous_namespace)::RAHMacros;
      }
      else if (Type == SHADER_TYPE_RAY_INTERSECTION) {
        puVar1 = (anonymous_namespace)::RIMacros;
      }
      else {
        if (Type != SHADER_TYPE_CALLABLE) {
          if (Type != SHADER_TYPE_LAST) goto switchD_001b5357_caseD_3;
          FormatString<char[24]>(&msg,(char (*) [24])"Unsupported shader type");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"GetShaderTypeMacros",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                     ,0x59);
          goto LAB_001b5390;
        }
        puVar1 = (anonymous_namespace)::RCMacros;
      }
    }
LAB_001b5413:
    uStack_30 = 1;
  }
  SVar2._8_8_ = uStack_30;
  SVar2.Elements = (ShaderMacro *)puVar1;
  return SVar2;
}

Assistant:

ShaderMacroArray GetShaderTypeMacros(SHADER_TYPE Type)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    switch (Type)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           return SHADER_MACROS_ARRAY(VSMacros);
        case SHADER_TYPE_PIXEL:            return SHADER_MACROS_ARRAY(PSMacros);
        case SHADER_TYPE_GEOMETRY:         return SHADER_MACROS_ARRAY(GSMacros);
        case SHADER_TYPE_HULL:             return SHADER_MACROS_ARRAY(HSMacros);
        case SHADER_TYPE_DOMAIN:           return SHADER_MACROS_ARRAY(DSMacros);
        case SHADER_TYPE_COMPUTE:          return SHADER_MACROS_ARRAY(CSMacros);
        case SHADER_TYPE_AMPLIFICATION:    return SHADER_MACROS_ARRAY(ASMacros);
        case SHADER_TYPE_MESH:             return SHADER_MACROS_ARRAY(MSMacros);
        case SHADER_TYPE_RAY_GEN:          return SHADER_MACROS_ARRAY(RGMacros);
        case SHADER_TYPE_RAY_MISS:         return SHADER_MACROS_ARRAY(RMMacros);
        case SHADER_TYPE_RAY_CLOSEST_HIT:  return SHADER_MACROS_ARRAY(RCHMacros);
        case SHADER_TYPE_RAY_ANY_HIT:      return SHADER_MACROS_ARRAY(RAHMacros);
        case SHADER_TYPE_RAY_INTERSECTION: return SHADER_MACROS_ARRAY(RIMacros);
        case SHADER_TYPE_CALLABLE:         return SHADER_MACROS_ARRAY(RCMacros);
        // clang-format on
        case SHADER_TYPE_TILE:
            UNEXPECTED("Unsupported shader type");
            return ShaderMacroArray{};
        default:
            UNEXPECTED("Unexpected shader type");
            return ShaderMacroArray{};
    }
}